

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ReplaceObsoleteElements(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Dict *pDVar2;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_DIR)) {
        prvTidyCoerceNode(doc,node,TidyTag_UL,yes,yes);
      }
      pDVar2 = node->tag;
      if ((pDVar2 != (Dict *)0x0) &&
         ((pDVar2->id == TidyTag_XMP ||
          ((pDVar2 != (Dict *)0x0 &&
           ((pDVar2->id == TidyTag_LISTING ||
            ((pDVar2 != (Dict *)0x0 && (pDVar2->id == TidyTag_PLAINTEXT)))))))))) {
        prvTidyCoerceNode(doc,node,TidyTag_PRE,yes,yes);
      }
      if (node->content != (Node *)0x0) {
        ReplaceObsoleteElements(doc,node->content);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

static void ReplaceObsoleteElements(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        /* if (nodeIsDIR(node) || nodeIsMENU(node)) */
        /* HTML5 - <menu ... > is no longer obsolete */
        if (nodeIsDIR(node))
            TY_(CoerceNode)(doc, node, TidyTag_UL, yes, yes);

        if (nodeIsXMP(node) || nodeIsLISTING(node) ||
            (node->tag && node->tag->id == TidyTag_PLAINTEXT))
            TY_(CoerceNode)(doc, node, TidyTag_PRE, yes, yes);

        if (node->content)
            ReplaceObsoleteElements(doc, node->content);

        node = next;
    }
}